

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVLABase<QString>::resize_impl
          (QVLABase<QString> *this,qsizetype prealloc,void *array,qsizetype sz,QString *v)

{
  QString *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QString *)(this->super_QVLABaseBase).ptr;
  if ((v < pQVar1) || (pQVar1 + (this->super_QVLABaseBase).s <= v)) {
    lVar2 = (this->super_QVLABaseBase).a;
    if (lVar2 <= sz) {
      lVar2 = sz;
    }
    reallocate_impl(this,prealloc,array,sz,lVar2);
    lVar2 = (this->super_QVLABaseBase).s;
    while (lVar2 < sz) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 (lVar2 * 0x18 + (long)(this->super_QVLABaseBase).ptr),&v->d);
      lVar2 = (this->super_QVLABaseBase).s + 1;
      (this->super_QVLABaseBase).s = lVar2;
    }
  }
  else {
    local_38.d = (v->d).d;
    local_38.ptr = (v->d).ptr;
    local_38.size = (v->d).size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resize_impl(this,prealloc,array,sz,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }